

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyMap.cxx
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmPropertyMap::GetList_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmPropertyMap *this)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  pointer ppVar5;
  __node_base *p_Var6;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::reserve(__return_storage_ptr__,(this->Map_)._M_h._M_element_count);
  p_Var6 = &(this->Map_)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 5));
  }
  ppVar1 = (__return_storage_ptr__->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    uVar4 = (long)ppVar2 - (long)ppVar1 >> 6;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmPropertyMap::GetList()const::__0>>
              (ppVar1,ppVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar2 - (long)ppVar1 < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmPropertyMap::GetList()const::__0>>
                (ppVar1,ppVar2);
    }
    else {
      ppVar5 = ppVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmPropertyMap::GetList()const::__0>>
                (ppVar1,ppVar5);
      for (; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<cmPropertyMap::GetList()const::__0>>
                  (ppVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, std::string>> cmPropertyMap::GetList() const
{
  typedef std::pair<std::string, std::string> StringPair;
  std::vector<StringPair> kvList;
  kvList.reserve(Map_.size());
  for (auto const& item : Map_) {
    kvList.emplace_back(item.first, item.second);
  }
  std::sort(kvList.begin(), kvList.end(),
            [](StringPair const& a, StringPair const& b) {
              return a.first < b.first;
            });
  return kvList;
}